

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  bool bVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  UnknownFieldSet *this_01;
  char *description;
  Descriptor *expected;
  Metadata MVar3;
  
  MVar3 = Message::GetMetadata(message);
  if (MVar3.reflection == this) {
    expected = this->descriptor_;
    if (field->containing_type_ == expected) {
      if ((byte)field->field_0x1 < 0xc0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
          anon_unknown_6::ReportReflectionUsageTypeError(expected,field,"SetEnumValue",CPPTYPE_ENUM)
          ;
        }
        bVar1 = internal::CreateUnknownEnumValues(field);
        if (!bVar1) {
          this_00 = FieldDescriptor::enum_type(field);
          pEVar2 = EnumDescriptor::FindValueByNumber(this_00,value);
          if (pEVar2 == (EnumValueDescriptor *)0x0) {
            this_01 = internal::InternalMetadata::
                      mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                                ((InternalMetadata *)
                                 ((long)&(message->super_MessageLite)._vptr_MessageLite +
                                 (ulong)(uint)(this->schema_).metadata_offset_));
            UnknownFieldSet::AddVarint(this_01,field->number_,(long)value);
            return;
          }
        }
        SetEnumValueInternal(this,message,field,value);
        return;
      }
      description = "Field is repeated; the method requires a singular field.";
      goto LAB_0024d75d;
    }
  }
  else {
    expected = this->descriptor_;
    MVar3 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,MVar3.descriptor,field,"SetEnumValue");
  }
  description = "Field does not match message type.";
LAB_0024d75d:
  anon_unknown_6::ReportReflectionUsageError(expected,field,"SetEnumValue",description);
}

Assistant:

void Reflection::SetEnumValue(Message* message, const FieldDescriptor* field,
                              int value) const {
  USAGE_MUTABLE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(field)) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetEnumValueInternal(message, field, value);
}